

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::SigHashType::GetSigHashFlag(SigHashType *this)

{
  SigHashAlgorithm local_14;
  uint32_t flag;
  SigHashType *this_local;
  
  local_14 = this->hash_algorithm_;
  if ((this->is_anyone_can_pay_ & 1U) != 0) {
    local_14 = this->kSigHashAnyOneCanPay | local_14;
  }
  if ((this->is_fork_id_ & 1U) != 0) {
    local_14 = this->kSigHashForkId | local_14;
  }
  return local_14;
}

Assistant:

uint32_t SigHashType::GetSigHashFlag() const {
  uint32_t flag = hash_algorithm_;
  if (is_anyone_can_pay_) {
    flag |= kSigHashAnyOneCanPay;
  }
  if (is_fork_id_) {
    flag |= kSigHashForkId;
  }
  return flag;
}